

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void detachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3 *db;
  Db *pDVar1;
  Btree *p;
  void *pvVar2;
  int iVar3;
  uchar *puVar4;
  HashElem *pHVar5;
  uchar *zName;
  char *zFormat;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  char zErr [128];
  
  puVar4 = sqlite3_value_text(*argv);
  zName = "";
  if (puVar4 != (uchar *)0x0) {
    zName = puVar4;
  }
  db = context->pOut->db;
  uVar7 = 0;
  uVar8 = (ulong)(uint)db->nDb;
  if (db->nDb < 1) {
    uVar8 = uVar7;
  }
  lVar6 = 0x18;
  do {
    if (uVar8 == uVar7) {
      zFormat = "no such database: %s";
LAB_001b7bef:
      sqlite3_snprintf(0x80,zErr,zFormat,zName);
      sqlite3_result_error(context,zErr,-1);
      return;
    }
    pDVar1 = db->aDb;
    p = *(Btree **)((long)pDVar1 + lVar6 + -0x10);
    if (p != (Btree *)0x0) {
      iVar3 = sqlite3DbIsNamed(db,(int)uVar7,(char *)zName);
      if (iVar3 != 0) {
        if (uVar7 < 2) {
          zFormat = "cannot detach database %s";
        }
        else {
          zFormat = "database %s is locked";
          if ((p->inTrans == '\0') && (p->nBackup == 0)) {
            pHVar5 = (HashElem *)&((pDVar1[1].pSchema)->trigHash).first;
            while (pHVar5 = pHVar5->next, pHVar5 != (HashElem *)0x0) {
              pvVar2 = pHVar5->data;
              if (*(long *)((long)pvVar2 + 0x30) == *(long *)((long)&pDVar1->zDbSName + lVar6)) {
                *(undefined8 *)((long)pvVar2 + 0x30) = *(undefined8 *)((long)pvVar2 + 0x28);
              }
            }
            sqlite3BtreeClose(p);
            *(undefined8 *)((long)pDVar1 + lVar6 + -0x10) = 0;
            *(undefined8 *)((long)&pDVar1->zDbSName + lVar6) = 0;
            sqlite3CollapseDatabaseArray(db);
            return;
          }
        }
        goto LAB_001b7bef;
      }
    }
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x20;
  } while( true );
}

Assistant:

static void detachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  const char *zName = (const char *)sqlite3_value_text(argv[0]);
  sqlite3 *db = sqlite3_context_db_handle(context);
  int i;
  Db *pDb = 0;
  HashElem *pEntry;
  char zErr[128];

  UNUSED_PARAMETER(NotUsed);

  if( zName==0 ) zName = "";
  for(i=0; i<db->nDb; i++){
    pDb = &db->aDb[i];
    if( pDb->pBt==0 ) continue;
    if( sqlite3DbIsNamed(db, i, zName) ) break;
  }

  if( i>=db->nDb ){
    sqlite3_snprintf(sizeof(zErr),zErr, "no such database: %s", zName);
    goto detach_error;
  }
  if( i<2 ){
    sqlite3_snprintf(sizeof(zErr),zErr, "cannot detach database %s", zName);
    goto detach_error;
  }
  if( sqlite3BtreeTxnState(pDb->pBt)!=SQLITE_TXN_NONE
   || sqlite3BtreeIsInBackup(pDb->pBt)
  ){
    sqlite3_snprintf(sizeof(zErr),zErr, "database %s is locked", zName);
    goto detach_error;
  }

  /* If any TEMP triggers reference the schema being detached, move those
  ** triggers to reference the TEMP schema itself. */
  assert( db->aDb[1].pSchema );
  pEntry = sqliteHashFirst(&db->aDb[1].pSchema->trigHash);
  while( pEntry ){
    Trigger *pTrig = (Trigger*)sqliteHashData(pEntry);
    if( pTrig->pTabSchema==pDb->pSchema ){
      pTrig->pTabSchema = pTrig->pSchema;
    }
    pEntry = sqliteHashNext(pEntry);
  }

  sqlite3BtreeClose(pDb->pBt);
  pDb->pBt = 0;
  pDb->pSchema = 0;
  sqlite3CollapseDatabaseArray(db);
  return;

detach_error:
  sqlite3_result_error(context, zErr, -1);
}